

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSupport.h
# Opt level: O2

byte * __thiscall
TTD::SlabAllocatorBase<0>::SlabAllocateLargeBlockSize<true>
          (SlabAllocatorBase<0> *this,size_t requestedBytes)

{
  LargeSlabBlock *pLVar1;
  HeapAllocator *this_00;
  uchar *alloc;
  LargeSlabBlock *pLVar2;
  uint uVar3;
  undefined1 local_40 [8];
  TrackAllocData data;
  ulong byteSize;
  
  if (requestedBytes < 0x1001) {
    TTDAbort_unrecoverable_error("Don\'t allocate small requests in the large pool.");
  }
  uVar3 = (int)requestedBytes + 0x2bU & 0xfffffffc;
  byteSize = (ulong)uVar3;
  if (requestedBytes + 0x28 <= byteSize) {
    if (this->m_reserveActiveBytes == 0) {
      local_40 = (undefined1  [8])&unsigned_char::typeinfo;
      data.typeinfo = (type_info *)0x0;
      data.count = (size_t)anon_var_dwarf_3eb50dd;
      data.filename._0_4_ = 0x24b;
      data.plusSize = byteSize;
      this_00 = Memory::HeapAllocator::TrackAllocInfo
                          (&Memory::HeapAllocator::Instance,(TrackAllocData *)local_40);
      alloc = (uchar *)Memory::HeapAllocator::AllocT<true>(this_00,byteSize);
      pLVar2 = (LargeSlabBlock *)TTD_MEM_ALLOC_CHECK<unsigned_char>(alloc);
      pLVar2->BlockData = (byte *)(pLVar2 + 1);
      pLVar2->TotalBlockSize = uVar3;
      pLVar1 = this->m_largeBlockList;
      pLVar2->Previous = pLVar1;
      pLVar2->Next = (LargeSlabBlock *)0x0;
      pLVar2->MetaDataSential = 0;
      this->m_totalAllocatedSize = this->m_totalAllocatedSize + byteSize;
      if (pLVar1 != (LargeSlabBlock *)0x0) {
        pLVar1->Next = pLVar2;
      }
      this->m_largeBlockList = pLVar2;
      return (byte *)(pLVar2 + 1);
    }
    TTDAbort_unrecoverable_error("Don\'t double allocate memory.");
  }
  TTDAbort_unrecoverable_error("We can never allocate a block this big with the slab allocator!!");
}

Assistant:

byte* SlabAllocateLargeBlockSize(size_t requestedBytes)
        {
            TTDAssert(requestedBytes > TTD_SLAB_LARGE_BLOCK_SIZE, "Don't allocate small requests in the large pool.");

            uint32 desiredsize = TTD_WORD_ALIGN_ALLOC_SIZE(requestedBytes + TTD_LARGE_SLAB_BLOCK_SIZE); //make alloc size word aligned
            TTDAssert((desiredsize % 4 == 0) & (desiredsize >= (requestedBytes + TTD_LARGE_SLAB_BLOCK_SIZE)), "We can never allocate a block this big with the slab allocator!!");

            TTDAssert(this->m_reserveActiveBytes == 0, "Don't double allocate memory.");

            byte* tmp = TT_HEAP_ALLOC_ARRAY(byte, desiredsize);

            LargeSlabBlock* newBlock = (LargeSlabBlock*)tmp;
            newBlock->BlockData = (tmp + TTD_LARGE_SLAB_BLOCK_SIZE);

            newBlock->TotalBlockSize = desiredsize;
            newBlock->Previous = this->m_largeBlockList;
            newBlock->Next = nullptr;

            newBlock->MetaDataSential = 0;

            if (commit)
            {
                this->CommitLargeBlockAllocation(newBlock, desiredsize);
            }
            else
            {
                this->m_reserveActiveBytes = desiredsize;
                this->m_reserveActiveLargeBlock = newBlock;
            }

            return newBlock->BlockData;
        }